

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::legacy::NTSCD::computeInterprocDependencies(NTSCD *this,Function *function)

{
  bool bVar1;
  reference ppVar2;
  reference ppBVar3;
  reference ppBVar4;
  int iVar5;
  _Self *p_Var6;
  Block *in_RDI;
  pair<std::__detail::_Node_iterator<dg::llvmdg::legacy::Block_*,_true,_false>,_bool> pVar7;
  Block *successor_1;
  iterator __end4;
  iterator __begin4;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range4;
  Block *successor;
  iterator __end3;
  iterator __begin3;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range3;
  unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  visited;
  queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  q;
  Block *node_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range2_1;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> join;
  iterator __end5_1;
  iterator __begin5_1;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range5_1;
  pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*> callee;
  iterator __end5;
  iterator __begin5;
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  *__range5;
  _Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> iterator;
  Block *node;
  iterator __end2;
  iterator __begin2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *__range2;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *nodes;
  Block *in_stack_fffffffffffffcb8;
  hasher *in_stack_fffffffffffffcc0;
  Block *in_stack_fffffffffffffcc8;
  Block *in_stack_fffffffffffffcd0;
  byte local_321;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf1;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> local_308;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> local_300;
  Block *local_2f8;
  _Self local_2f0;
  _Self in_stack_fffffffffffffd18;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> local_2c8;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> local_2c0;
  Block *local_2b8;
  _Self local_2b0;
  _Self local_2a8;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *local_2a0;
  _Node_iterator_base<dg::llvmdg::legacy::Block_*,_false> local_298;
  undefined1 local_290;
  Block *local_1f8;
  _Self local_1f0;
  _Self local_1e8;
  undefined1 local_1e0 [48];
  undefined1 *local_1b0;
  Function *local_1a8;
  Function *local_1a0;
  _Self local_198;
  _Self local_190;
  undefined1 local_188 [48];
  undefined1 *local_158;
  Function *local_150;
  Function *local_148;
  _Self local_140;
  _Self local_138;
  undefined1 local_130 [48];
  undefined1 *local_100;
  _Self local_f8 [2];
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  _Self local_d8;
  byte local_c9;
  Block *local_68;
  _Self local_60;
  _Self local_58;
  undefined1 *local_50;
  undefined1 local_48 [48];
  undefined1 *local_18;
  
  Function::nodes((Function *)in_stack_fffffffffffffcb8);
  local_50 = local_48;
  local_18 = local_50;
  local_58._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)in_stack_fffffffffffffcb8);
  local_60._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)in_stack_fffffffffffffcb8);
  while (bVar1 = std::operator!=(&local_58,&local_60), bVar1) {
    ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                        ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x2285fe);
    local_68 = *ppBVar3;
    Block::callees(in_stack_fffffffffffffcb8);
    bVar1 = std::
            map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
            ::empty((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                     *)0x22862b);
    local_c9 = 0;
    local_321 = 1;
    if (bVar1) {
      Block::joins(in_stack_fffffffffffffcb8);
      local_c9 = 1;
      bVar1 = std::
              map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
              ::empty((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                       *)0x22866c);
      local_321 = bVar1 ^ 0xff;
    }
    if ((local_c9 & 1) != 0) {
      std::
      map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::~map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
              *)0x228693);
    }
    std::
    map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
    ::~map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
            *)0x2286a0);
    if ((local_321 & 1) != 0) {
      Block::successors(local_68);
      local_e0 = (_Base_ptr)
                 std::
                 set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                 ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                          *)in_stack_fffffffffffffcb8);
      Block::successors(local_68);
      local_e8 = (_Base_ptr)
                 std::
                 set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                 ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                        *)in_stack_fffffffffffffcb8);
      local_d8._M_node =
           (_Base_ptr)
           std::
           find_if<std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block*>,dg::llvmdg::legacy::NTSCD::computeInterprocDependencies(dg::llvmdg::legacy::Function*)::__0>
                     (local_e0,local_e8);
      Block::successors(local_68);
      local_f8[0]._M_node =
           (_Base_ptr)
           std::
           set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)in_stack_fffffffffffffcb8);
      bVar1 = std::operator!=(&local_d8,local_f8);
      if (bVar1) {
        Block::callees(in_stack_fffffffffffffcb8);
        local_100 = local_130;
        local_138._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
             ::begin((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)in_stack_fffffffffffffcb8);
        local_140._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
             ::end((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)in_stack_fffffffffffffcb8);
        while( true ) {
          p_Var6 = &local_140;
          bVar1 = std::operator!=(&local_138,p_Var6);
          iVar5 = (int)p_Var6;
          if (!bVar1) break;
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                                *)0x2287c3);
          local_150 = ppVar2->first;
          local_148 = ppVar2->second;
          ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x2287e7);
          in_stack_fffffffffffffcd0 = *ppBVar3;
          Function::exit(local_148,iVar5);
          addControlDependence
                    ((NTSCD *)CONCAT71(in_stack_fffffffffffffcf1,in_stack_fffffffffffffcf0),
                     (Block *)in_stack_fffffffffffffce8._M_cur,in_RDI);
          std::
          _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                        *)in_stack_fffffffffffffcc0);
        }
        std::
        map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::~map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                *)0x2287b4);
        Block::joins(in_stack_fffffffffffffcb8);
        local_158 = local_188;
        local_190._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
             ::begin((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                      *)in_stack_fffffffffffffcb8);
        local_198._M_node =
             (_Base_ptr)
             std::
             map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
             ::end((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                    *)in_stack_fffffffffffffcb8);
        while( true ) {
          p_Var6 = &local_198;
          bVar1 = std::operator!=(&local_190,p_Var6);
          iVar5 = (int)p_Var6;
          if (!bVar1) break;
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                   ::operator*((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                                *)0x2288a4);
          local_1a8 = ppVar2->first;
          local_1a0 = ppVar2->second;
          ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x2288c8);
          in_stack_fffffffffffffcc8 = *ppBVar3;
          Function::exit(local_1a0,iVar5);
          addControlDependence
                    ((NTSCD *)CONCAT71(in_stack_fffffffffffffcf1,in_stack_fffffffffffffcf0),
                     (Block *)in_stack_fffffffffffffce8._M_cur,in_RDI);
          std::
          _Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>
                        *)in_stack_fffffffffffffcc0);
        }
        std::
        map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
        ::~map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                *)0x228895);
      }
    }
    std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)in_stack_fffffffffffffcc0);
  }
  Function::callReturnNodes((Function *)in_stack_fffffffffffffd18._M_node);
  local_1b0 = local_1e0;
  local_1e8._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)in_stack_fffffffffffffcb8);
  local_1f0._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
       ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              *)in_stack_fffffffffffffcb8);
  while (bVar1 = std::operator!=(&local_1e8,&local_1f0), bVar1) {
    ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                        ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x2289a0);
    local_1f8 = *ppBVar3;
    std::
    queue<dg::llvmdg::legacy::Block*,std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>>
    ::queue<std::deque<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>,void>
              ((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                *)in_stack_fffffffffffffcc0);
    in_stack_fffffffffffffcc0 =
         (hasher *)
         std::
         set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         ::size((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                 *)0x2289c5);
    std::allocator<dg::llvmdg::legacy::Block_*>::allocator
              ((allocator<dg::llvmdg::legacy::Block_*> *)0x2289d7);
    std::
    unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::unordered_set((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                     *)in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8,
                    in_stack_fffffffffffffcc0,(key_equal *)in_stack_fffffffffffffcb8,
                    (allocator_type *)0x228a01);
    std::allocator<dg::llvmdg::legacy::Block_*>::~allocator
              ((allocator<dg::llvmdg::legacy::Block_*> *)0x228a0e);
    pVar7 = std::
            unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ::insert((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                      *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
    local_298._M_cur =
         (__node_type *)
         pVar7.first.super__Node_iterator_base<dg::llvmdg::legacy::Block_*,_false>._M_cur;
    local_290 = pVar7.second;
    local_2a0 = Block::successors(local_1f8);
    local_2a8._M_node =
         (_Base_ptr)
         std::
         set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)in_stack_fffffffffffffcb8);
    local_2b0._M_node =
         (_Base_ptr)
         std::
         set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)in_stack_fffffffffffffcb8);
    while (bVar1 = std::operator!=(&local_2a8,&local_2b0), bVar1) {
      ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                          ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x228a9c);
      local_2b8 = *ppBVar3;
      local_2c0._M_cur =
           (__node_type *)
           std::
           unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::find((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                   *)in_stack_fffffffffffffcb8,(key_type *)0x228abc);
      local_2c8._M_cur =
           (__node_type *)
           std::
           unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::end((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)in_stack_fffffffffffffcb8);
      bVar1 = std::__detail::operator==(&local_2c0,&local_2c8);
      if (bVar1) {
        std::
        queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
        ::push((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                *)in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
        std::
        unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
        ::insert((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
      }
      std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
                ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)in_stack_fffffffffffffcc0);
    }
    while (bVar1 = std::
                   queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                   ::empty((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                            *)0x228b4a), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
      ::front((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
               *)0x228b62);
      addControlDependence
                ((NTSCD *)CONCAT71(in_stack_fffffffffffffcf1,in_stack_fffffffffffffcf0),
                 (Block *)in_stack_fffffffffffffce8._M_cur,in_RDI);
      ppBVar4 = std::
                queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                ::front((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                         *)0x228b84);
      Block::successors(*ppBVar4);
      std::
      set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::begin((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
               *)in_stack_fffffffffffffcb8);
      local_2f0._M_node =
           (_Base_ptr)
           std::
           set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
           ::end((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)in_stack_fffffffffffffcb8);
      while (bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffd18,&local_2f0), bVar1) {
        ppBVar3 = std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator*
                            ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)0x228bd1);
        local_2f8 = *ppBVar3;
        local_300._M_cur =
             (__node_type *)
             std::
             unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
             ::find((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                     *)in_stack_fffffffffffffcb8,(key_type *)0x228beb);
        local_308._M_cur =
             (__node_type *)
             std::
             unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
             ::end((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                    *)in_stack_fffffffffffffcb8);
        bVar1 = std::__detail::operator==(&local_300,&local_308);
        if (bVar1) {
          std::
          queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
          ::push((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
                  *)in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
          pVar7 = std::
                  unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  ::insert((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                            *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
          in_stack_fffffffffffffce8._M_cur =
               (__node_type *)
               pVar7.first.super__Node_iterator_base<dg::llvmdg::legacy::Block_*,_false>._M_cur;
          in_stack_fffffffffffffcf0 = pVar7.second;
        }
        std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
                  ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)in_stack_fffffffffffffcc0
                  );
      }
      std::
      queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
      ::pop((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
             *)0x228c62);
    }
    std::
    unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::~unordered_set((unordered_set<dg::llvmdg::legacy::Block_*,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                      *)0x228c74);
    std::
    queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
    ::~queue((queue<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
              *)0x228c81);
    std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*>::operator++
              ((_Rb_tree_const_iterator<dg::llvmdg::legacy::Block_*> *)in_stack_fffffffffffffcc0);
  }
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::~set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          *)0x22898e);
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::~set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          *)0x228ca0);
  return;
}

Assistant:

void NTSCD::computeInterprocDependencies(Function *function) {
    DBG_SECTION_BEGIN(cda, "Computing interprocedural CD");

    const auto &nodes = function->nodes();
    for (auto *node : nodes) {
        if (!node->callees().empty() || !node->joins().empty()) {
            auto iterator = std::find_if(
                    node->successors().begin(), node->successors().end(),
                    [](const Block *block) { return block->isCallReturn(); });
            if (iterator != node->successors().end()) {
                for (auto callee : node->callees()) {
                    addControlDependence(*iterator, callee.second->exit());
                }
                for (auto join : node->joins()) {
                    addControlDependence(*iterator, join.second->exit());
                }
            }
        }
    }

    for (auto *node : function->callReturnNodes()) {
        std::queue<Block *> q;
        std::unordered_set<Block *> visited(nodes.size());
        visited.insert(node);
        for (auto *successor : node->successors()) {
            if (visited.find(successor) == visited.end()) {
                q.push(successor);
                visited.insert(successor);
            }
        }
        while (!q.empty()) {
            addControlDependence(q.front(), node);
            for (auto *successor : q.front()->successors()) {
                if (visited.find(successor) == visited.end()) {
                    q.push(successor);
                    visited.insert(successor);
                }
            }
            q.pop();
        }
    }
    DBG_SECTION_END(cda, "Finished computing interprocedural CD");
}